

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_(unsigned_int,_unsigned_int)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3147:19)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3147:19)>
             *this,uint params,uint params_1)

{
  RemoveConst<CallbackEvent> **ppRVar1;
  Vector<CallbackEvent> *pVVar2;
  RemoveConst<CallbackEvent> *pRVar3;
  CallbackEvent *pCVar4;
  ArrayDisposer *pAVar5;
  CallbackEvent *__dest;
  RemoveConst<CallbackEvent> RVar6;
  CallbackEvent *__src;
  RemoveConst<CallbackEvent> *pRVar7;
  ulong capacity;
  size_t __n;
  CallbackEvent *pCVar8;
  CallbackEvent *pCVar9;
  CallbackEvent *pCVar10;
  undefined8 *puVar11;
  
  pVVar2 = (this->f).callbackEvents;
  pRVar7 = (pVVar2->builder).pos;
  if (pRVar7 == (pVVar2->builder).endPtr) {
    pCVar8 = (pVVar2->builder).ptr;
    capacity = 4;
    if ((long)pRVar7 - (long)pCVar8 != 0) {
      capacity = (long)pRVar7 - (long)pCVar8 >> 2;
    }
    if (capacity < (ulong)((long)pRVar7 - (long)pCVar8 >> 3)) {
      (pVVar2->builder).pos = pCVar8 + capacity;
    }
    __dest = (CallbackEvent *)
             _::HeapArrayDisposer::allocateImpl
                       (8,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    pCVar8 = __dest + capacity;
    puVar11 = &_::HeapArrayDisposer::instance;
    __src = (pVVar2->builder).ptr;
    __n = (long)(pVVar2->builder).pos - (long)__src;
    pCVar9 = __dest;
    pCVar10 = pCVar8;
    if (__n != 0) {
      memcpy(__dest,__src,__n);
      __src = (pVVar2->builder).ptr;
    }
    pRVar7 = (RemoveConst<CallbackEvent> *)((long)__dest + __n);
    if (__src != (CallbackEvent *)0x0) {
      pRVar3 = (pVVar2->builder).pos;
      pCVar4 = (pVVar2->builder).endPtr;
      (pVVar2->builder).ptr = (CallbackEvent *)0x0;
      (pVVar2->builder).pos = (RemoveConst<CallbackEvent> *)0x0;
      (pVVar2->builder).endPtr = (CallbackEvent *)0x0;
      pAVar5 = (pVVar2->builder).disposer;
      (**pAVar5->_vptr_ArrayDisposer)
                (pAVar5,__src,8,(long)pRVar3 - (long)__src >> 3,(long)pCVar4 - (long)__src >> 3,0,
                 pCVar8,pCVar9,pRVar7,pCVar10,puVar11);
    }
    (pVVar2->builder).ptr = __dest;
    (pVVar2->builder).pos = pRVar7;
    (pVVar2->builder).endPtr = pCVar8;
    (pVVar2->builder).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  }
  RVar6.pendingCount = params_1;
  RVar6.runningCount = params;
  *pRVar7 = RVar6;
  ppRVar1 = &(pVVar2->builder).pos;
  *ppRVar1 = *ppRVar1 + 1;
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }